

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

void __thiscall OpenMD::HydroProp::HydroProp(HydroProp *this,Vector3d *cor,Mat6x6d *Xi)

{
  string *in_RDI;
  string *this_00;
  SquareMatrix<double,_6> *in_stack_ffffffffffffffa8;
  Vector3<double> *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string(in_RDI);
  Vector3<double>::Vector3(in_stack_ffffffffffffffb0,(Vector3<double> *)in_stack_ffffffffffffffa8);
  this_00 = in_RDI + 0x38;
  SquareMatrix<double,_6>::SquareMatrix
            ((SquareMatrix<double,_6> *)this_00,in_stack_ffffffffffffffa8);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)this_00);
  in_RDI[0x278] = (string)0x1;
  in_RDI[0x279] = (string)0x1;
  in_RDI[0x27a] = (string)0x0;
  return;
}

Assistant:

HydroProp::HydroProp(Vector3d cor, Mat6x6d Xi) :
      cor_(cor), Xi_(Xi), hasCOR_(true), hasXi_(true), hasS_(false) {}